

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O3

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
          (directed_flag_complex_computer_t *this,int dimension)

{
  pointer pcVar1;
  pointer pcVar2;
  iterator iVar3;
  pointer puVar4;
  _Map_pointer ppuVar5;
  bool bVar6;
  uint uVar7;
  undefined3 uVar8;
  filtered_directed_graph_t *pfVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  ostream *poVar14;
  long *plVar15;
  undefined8 uVar16;
  pointer pfVar17;
  _Map_pointer *pppuVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  pointer pcVar22;
  _Map_pointer ppiVar23;
  uint uVar24;
  long lVar25;
  char cVar26;
  size_type __n;
  int *piVar27;
  store_coboundaries_in_cache_t *psVar28;
  unsigned_long uVar29;
  compressed_sparse_matrix<int> *this_00;
  uint uVar30;
  _Hash_node_base *p_Var31;
  ulong uVar32;
  pointer puVar33;
  undefined1 auVar34 [8];
  pointer pcVar35;
  pointer pfVar36;
  byte bVar37;
  string fname;
  value_t next_value;
  float f_2;
  vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  store_coboundaries;
  index_t next_value_1;
  compressed_sparse_matrix<int> p;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2b8;
  const_iterator local_2b0;
  uint local_290;
  float local_28c;
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  local_288;
  const_iterator local_268;
  undefined1 local_240 [8];
  filtered_directed_graph_t *pfStack_238;
  undefined1 local_230 [72];
  pointer puStack_1e8;
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  _Map_pointer ppiStack_1c8;
  pointer local_1c0;
  pointer puStack_1b8;
  pointer local_1b0;
  _Map_pointer ppiStack_1a8;
  ios_base local_148 [272];
  string *local_38;
  
  bVar37 = 0;
  if (dimension == 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"preparing dimension ",0x14);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,": indexing ",0xb);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,dimension);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-dimensional cells",0x12);
  poVar14 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\r",1);
  this->current_dimension = dimension;
  uVar24 = dimension + 1;
  cell_hasher_t::dimension = (unsigned_short)uVar24;
  local_2b8 = &this->cell_count;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_2b8,(long)(dimension + 2));
  pcVar35 = (this->coboundary_matrix).
            super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->coboundary_matrix).
           super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar35 != pcVar1) {
    do {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,&pcVar35->bounds)
      ;
      std::deque<int,_std::allocator<int>_>::deque
                ((deque<int,_std::allocator<int>_> *)(local_230 + 0x40),&pcVar35->entries);
      compressed_sparse_matrix<int>::clear((compressed_sparse_matrix<int> *)local_240);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)(local_230 + 0x40));
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
      pcVar35 = pcVar35 + 1;
    } while (pcVar35 != pcVar1);
  }
  if ((int)(uint)this->max_dimension < dimension) {
    return;
  }
  if (this->_is_top_dimension != false) {
    return;
  }
  local_38 = &this->cache;
  iVar12 = std::__cxx11::string::compare((char *)local_38);
  local_290 = uVar24;
  if (iVar12 != 0) {
    if (this->nb_threads == 0) {
      local_2c0 = (vector<float,_std::allocator<float>_> *)((ulong)local_2c0._4_4_ << 0x20);
    }
    else {
      uVar32 = 0;
      local_2c0 = (vector<float,_std::allocator<float>_> *)((ulong)local_2c0._4_4_ << 0x20);
      do {
        compressed_sparse_matrix<int>::clear
                  ((this->coboundary_matrix).
                   super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar32);
        pcVar2 = (this->cache)._M_dataplus._M_p;
        local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2e0,pcVar2,pcVar2 + (this->cache)._M_string_length);
        std::__cxx11::string::append((char *)local_2e0);
        uVar24 = this->current_dimension;
        uVar7 = -uVar24;
        if (0 < (int)uVar24) {
          uVar7 = uVar24;
        }
        uVar30 = 1;
        if (9 < uVar7) {
          uVar19 = (ulong)uVar7;
          uVar10 = 4;
          do {
            uVar30 = uVar10;
            uVar13 = (uint)uVar19;
            if (uVar13 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_0011fa3e;
            }
            if (uVar13 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_0011fa3e;
            }
            if (uVar13 < 10000) goto LAB_0011fa3e;
            uVar19 = uVar19 / 10000;
            uVar10 = uVar30 + 4;
          } while (99999 < uVar13);
          uVar30 = uVar30 + 1;
        }
LAB_0011fa3e:
        local_240 = (undefined1  [8])local_230;
        std::__cxx11::string::_M_construct
                  ((ulong)local_240,(char)uVar30 - (char)((int)uVar24 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&((directed_graph_t *)local_240)->number_of_vertices +
                           (ulong)(uVar24 >> 0x1f)),uVar30,uVar7);
        std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
        if (local_240 != (undefined1  [8])local_230) {
          operator_delete((void *)local_240,
                          (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_230._0_8_)->
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Deque_impl_data._M_map + 1));
        }
        std::__cxx11::string::append(local_2e0);
        cVar26 = '\x01';
        if (9 < uVar32) {
          uVar19 = uVar32;
          cVar11 = '\x04';
          do {
            cVar26 = cVar11;
            if (uVar19 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_0011fb2e;
            }
            if (uVar19 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_0011fb2e;
            }
            if (uVar19 < 10000) goto LAB_0011fb2e;
            bVar6 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar11 = cVar26 + '\x04';
          } while (bVar6);
          cVar26 = cVar26 + '\x01';
        }
LAB_0011fb2e:
        local_240 = (undefined1  [8])local_230;
        std::__cxx11::string::_M_construct((ulong)local_240,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_240,(uint)pfStack_238,uVar32)
        ;
        std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
        if (local_240 != (undefined1  [8])local_230) {
          operator_delete((void *)local_240,
                          (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_230._0_8_)->
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Deque_impl_data._M_map + 1));
        }
        std::ifstream::ifstream(local_240,(char *)local_2e0._0_8_,_S_bin);
        if ((uVar32 == 0) &&
           (*(int *)(local_230 +
                    (long)((((filtered_directed_graph_t *)((long)local_240 + -0xd8))->
                           edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 4)) != 0)) {
          bVar6 = false;
        }
        else {
          std::istream::read(local_240,
                             (long)((this->cell_count).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                   (long)this->current_dimension + 1));
          std::istream::read(local_240,
                             (long)((this->coboundary_matrix_offsets).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar32));
          std::istream::read(local_240,(long)&local_2b0);
          while (((_Map_pointer)local_2b0._M_cur != (_Map_pointer)0x0 &&
                 (plVar15 = (long *)std::istream::read(local_240,(long)&local_268),
                 (*(byte *)((long)plVar15 + *(long *)(*plVar15 + -0x18) + 0x20) & 5) == 0))) {
            this_00 = (this->coboundary_matrix).
                      super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar32;
            if ((int)local_268._M_cur == -1) {
              compressed_sparse_matrix<int>::append_column(this_00);
            }
            else {
              compressed_sparse_matrix<int>::push_back(this_00,(int)local_268._M_cur);
            }
          }
          uVar16 = std::ifstream::close();
          local_2c0 = (vector<float,_std::allocator<float>_> *)
                      CONCAT44(local_2c0._4_4_,(int)CONCAT71((int7)((ulong)uVar16 >> 8),1));
          bVar6 = true;
        }
        std::ifstream::~ifstream(local_240);
        if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
          operator_delete((void *)local_2e0._0_8_,
                          (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                     *)local_2e0._16_8_)->_M_h).field_0x1);
        }
      } while ((bVar6) && (uVar32 = uVar32 + 1, uVar32 < this->nb_threads));
    }
    pcVar2 = (this->cache)._M_dataplus._M_p;
    local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e0,pcVar2,pcVar2 + (this->cache)._M_string_length);
    std::__cxx11::string::append((char *)local_2e0);
    uVar24 = this->current_dimension;
    uVar7 = -uVar24;
    if (0 < (int)uVar24) {
      uVar7 = uVar24;
    }
    uVar30 = 1;
    if (9 < uVar7) {
      uVar32 = (ulong)uVar7;
      uVar10 = 4;
      do {
        uVar30 = uVar10;
        uVar13 = (uint)uVar32;
        if (uVar13 < 100) {
          uVar30 = uVar30 - 2;
          goto LAB_0011fd5f;
        }
        if (uVar13 < 1000) {
          uVar30 = uVar30 - 1;
          goto LAB_0011fd5f;
        }
        if (uVar13 < 10000) goto LAB_0011fd5f;
        uVar32 = uVar32 / 10000;
        uVar10 = uVar30 + 4;
      } while (99999 < uVar13);
      uVar30 = uVar30 + 1;
    }
LAB_0011fd5f:
    local_240 = (undefined1  [8])local_230;
    std::__cxx11::string::_M_construct((ulong)local_240,(char)uVar30 - (char)((int)uVar24 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&((directed_graph_t *)local_240)->number_of_vertices +
                       (ulong)(uVar24 >> 0x1f)),uVar30,uVar7);
    std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
    uVar24 = local_290;
    if (local_240 != (undefined1  [8])local_230) {
      operator_delete((void *)local_240,
                      (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      local_230._0_8_)->
                                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Deque_impl_data._M_map + 1));
    }
    std::ifstream::ifstream(local_240,(char *)local_2e0._0_8_,_S_bin);
    pfVar36 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar36) {
      (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar36;
    }
    while (plVar15 = (long *)std::istream::read(local_240,(long)&local_2b0),
          (*(byte *)((long)plVar15 + *(long *)(*plVar15 + -0x18) + 0x20) & 5) == 0) {
      iVar3._M_current =
           (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&this->next_filtration,iVar3,
                   (float *)&local_2b0);
      }
      else {
        *iVar3._M_current = local_2b0._M_cur._0_4_;
        (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
    }
    std::ifstream::close();
    if (((ulong)local_2c0 & 1) != 0) {
      this->_is_top_dimension =
           (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)this->current_dimension + 1] == 0;
    }
    std::ifstream::~ifstream(local_240);
    if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
      operator_delete((void *)local_2e0._0_8_,
                      (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                 *)local_2e0._16_8_)->_M_h).field_0x1);
    }
    if (((ulong)local_2c0 & 1) != 0) {
      return;
    }
  }
  if (this->filtration_algorithm != (filtration_algorithm_t *)0x0) {
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              *)local_2e0,this->nb_threads,(allocator_type *)local_240);
    local_240 = (undefined1  [8])0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b0,this->nb_threads,
               (value_type_conflict3 *)local_240,(allocator_type *)&local_268);
    local_268._M_cur = (_Elt_pointer)0x0;
    local_268._M_first = (_Elt_pointer)0x0;
    local_268._M_last = (_Elt_pointer)0x0;
    if (this->nb_threads != 0) {
      uVar32 = 0;
      do {
        local_240 = (undefined1  [8])(local_2e0._0_8_ + uVar32 * 0x40);
        pfStack_238 = (filtered_directed_graph_t *)CONCAT44(pfStack_238._4_4_,0xffffffff);
        if (local_268._M_first == local_268._M_last) {
          std::
          vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
          ::_M_realloc_insert<directed_flag_complex_computer::add_cell_index_to_cache_t>
                    ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                      *)&local_268,(iterator)local_268._M_first,
                     (add_cell_index_to_cache_t *)local_240);
        }
        else {
          *(cell_hash_map_t **)local_268._M_first = (cell_hash_map_t *)local_240;
          *(filtered_directed_graph_t **)((long)local_268._M_first + 8) = pfStack_238;
          local_268._M_first = (_Elt_pointer)((long)local_268._M_first + 0x10);
        }
        for (puVar33 = (((directed_graph_t *)local_240)->edges).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage; puVar33 != (pointer)0x0;
            puVar33 = *(pointer *)puVar33) {
          if (*(void **)(puVar33 + 8) != (void *)0x0) {
            operator_delete__(*(void **)(puVar33 + 8));
          }
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < this->nb_threads);
    }
    cell_hasher_t::dimension = (unsigned_short)dimension;
    iVar12 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar12 != '\0') {
      directed_flag_complex_t::
      for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                (&this->flag_complex,
                 (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                  *)&local_268,dimension,-1);
    }
    if (((int)(uint)this->min_dimension <= (int)uVar24) ||
       (iVar12 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])(),
       (char)iVar12 != '\0')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"preparing dimension ",0x14);
      poVar14 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,": computing the filtration of all ",0x22);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-dimensional cells",0x12);
      poVar14 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\r",1);
      local_288.
      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (this->nb_threads != 0) {
        local_2c0 = &this->next_filtration;
        lVar25 = 0x20;
        uVar32 = 0;
        piVar27 = (int *)0x0;
        do {
          *(int **)((long)local_2b0._M_cur + uVar32 * 8) = piVar27;
          iVar12 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
          if ((char)iVar12 != '\0') {
            piVar27 = (int *)((long)piVar27 +
                             *(long *)(&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                           *)local_2e0._0_8_)->_M_h).field_0x0 + lVar25));
          }
          pfStack_238 = this->graph;
          local_230._8_8_ = this->filtration_algorithm;
          local_230._16_8_ = &pfStack_238->edge_filtration;
          if (dimension != 1) {
            local_230._16_8_ = local_2c0;
          }
          local_230._56_8_ = this->nb_threads;
          local_240._0_4_ = 0xffffffff;
          local_230._0_8_ = (compressed_sparse_matrix<int> *)0x0;
          local_230._40_8_ = (pointer)0x0;
          local_230._24_8_ = (const_iterator *)0x0;
          local_230._32_8_ = (pointer)0x0;
          local_230._48_8_ = local_2e0;
          local_230._64_8_ = local_2b0._M_cur;
          std::
          vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ::emplace_back<directed_flag_complex_computer::compute_filtration_t>
                    (&local_288,(compute_filtration_t *)local_240);
          if ((const_iterator *)local_230._24_8_ != (const_iterator *)0x0) {
            operator_delete((void *)local_230._24_8_,local_230._40_8_ - local_230._24_8_);
          }
          uVar32 = uVar32 + 1;
          lVar25 = lVar25 + 0x40;
        } while (uVar32 < this->nb_threads);
      }
      uVar24 = local_290;
      directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::compute_filtration_t>
                (&this->flag_complex,&local_288,local_290,-1);
      sVar20 = this->nb_threads;
      if (sVar20 == 0) {
        (local_2b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[(int)uVar24] = 0;
LAB_001201f6:
        this->_is_top_dimension = true;
        __n = 0;
      }
      else {
        __n = 0;
        pcVar22 = local_288.
                  super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          __n = __n + 1 + (long)pcVar22->current_index;
          pcVar22 = pcVar22 + 1;
          sVar20 = sVar20 - 1;
        } while (sVar20 != 0);
        (local_2b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[(int)uVar24] = __n;
        if (__n == 0) goto LAB_001201f6;
      }
      pfVar36 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar36) {
        (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar36;
      }
      std::vector<float,_std::allocator<float>_>::reserve(&this->next_filtration,__n);
      if (this->nb_threads != 0) {
        uVar32 = 0;
        do {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_240,
                     &local_288.
                      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar32].next_filtration);
          pfVar9 = pfStack_238;
          for (auVar34 = local_240; auVar34 != (undefined1  [8])pfVar9;
              auVar34 = (undefined1  [8])
                        &(((filtered_directed_graph_t *)auVar34)->super_directed_graph_t).field_0x4)
          {
            local_28c = *(float *)&((filtered_directed_graph_t *)auVar34)->super_directed_graph_t;
            iVar3._M_current =
                 (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&this->next_filtration,iVar3,
                         &local_28c);
            }
            else {
              *iVar3._M_current = local_28c;
              (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          if (local_240 != (undefined1  [8])0x0) {
            operator_delete((void *)local_240,local_230._0_8_ - (long)local_240);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 < this->nb_threads);
      }
      std::
      vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ::~vector(&local_288);
      uVar24 = local_290;
    }
    std::
    vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
    ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
               *)&local_268);
    if ((_Map_pointer)local_2b0._M_cur != (_Map_pointer)0x0) {
      operator_delete(local_2b0._M_cur,(long)local_2b0._M_last - (long)local_2b0._M_cur);
    }
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
               *)local_2e0);
  }
  if ((int)uVar24 < (int)(uint)this->min_dimension) {
    return;
  }
  cell_hasher_t::dimension = (unsigned_short)uVar24;
  std::
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
            *)local_2e0,this->nb_threads,(allocator_type *)local_240);
  local_240 = (undefined1  [8])0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b0,this->nb_threads,
             (value_type_conflict3 *)local_240,(allocator_type *)&local_268);
  local_268._M_cur = (_Elt_pointer)0x0;
  local_268._M_first = (_Elt_pointer)0x0;
  local_268._M_last = (_Elt_pointer)0x0;
  if (this->nb_threads != 0) {
    uVar32 = 0;
    do {
      local_240 = (undefined1  [8])(local_2e0._0_8_ + uVar32 * 0x40);
      pfStack_238 = (filtered_directed_graph_t *)CONCAT44(pfStack_238._4_4_,0xffffffff);
      if (local_268._M_first == local_268._M_last) {
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::_M_realloc_insert<directed_flag_complex_computer::add_cell_index_to_cache_t>
                  ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                    *)&local_268,(iterator)local_268._M_first,(add_cell_index_to_cache_t *)local_240
                  );
      }
      else {
        *(cell_hash_map_t **)local_268._M_first = (cell_hash_map_t *)local_240;
        *(filtered_directed_graph_t **)((long)local_268._M_first + 8) = pfStack_238;
        local_268._M_first = (_Elt_pointer)((long)local_268._M_first + 0x10);
      }
      for (p_Var31 = (((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                        *)local_240)->_M_h)._M_before_begin._M_nxt;
          p_Var31 != (_Hash_node_base *)0x0; p_Var31 = p_Var31->_M_nxt) {
        if (p_Var31[2]._M_nxt != (_Hash_node_base *)0x0) {
          operator_delete__(p_Var31[2]._M_nxt);
        }
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < this->nb_threads);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"preparing dimension ",0x14);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,": indexing ",0xb);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-dimensional cells",0x12);
  poVar14 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\r",1);
  if (this->_is_top_dimension == false) {
    directed_flag_complex_t::
    for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
              (&this->flag_complex,
               (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                *)&local_268,uVar24,-1);
    if (this->nb_threads == 0) {
      (local_2b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar24] = 0;
    }
    else {
      ppiVar23 = (_Map_pointer)((long)local_268._M_cur + 8);
      uVar32 = 0;
      piVar27 = (int *)0x0;
      do {
        *(int **)((long)local_2b0._M_cur + uVar32 * 8) = piVar27;
        piVar27 = (int *)((long)piVar27 + (long)*(int *)ppiVar23 + 1);
        uVar32 = uVar32 + 1;
        ppiVar23 = ppiVar23 + 2;
      } while (uVar32 < this->nb_threads);
      (local_2b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar24] = (unsigned_long)piVar27;
      if (piVar27 != (int *)0x0) goto LAB_00120515;
    }
    this->_is_top_dimension = true;
  }
LAB_00120515:
  local_288.
  super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c0 = (vector<float,_std::allocator<float>_> *)(long)dimension;
  if (this->nb_threads != 0) {
    lVar25 = 0x50;
    pfVar36 = (pointer)0x0;
    do {
      memset((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,0,0xa0);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,0);
      local_1b0 = (pointer)0x0;
      ppiStack_1a8 = (_Map_pointer)0x0;
      local_1c0 = (pointer)0x0;
      puStack_1b8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      ppiStack_1c8 = (_Map_pointer)0x0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      local_230._64_8_ = (_Map_pointer)0x0;
      puStack_1e8 = (pointer)0x0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
                ((_Deque_base<int,_std::allocator<int>_> *)(local_230 + 0x40),0);
      pcVar35 = (this->coboundary_matrix).
                super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign1
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)pcVar35 + lVar25 + -0x50),
                 (_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
      std::deque<int,_std::allocator<int>_>::_M_move_assign1
                ((deque<int,_std::allocator<int>_> *)
                 ((long)&(pcVar35->bounds).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_map + lVar25));
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)(local_230 + 0x40));
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
      pfVar36 = (pointer)((long)pfVar36 + 1);
      pfVar17 = (pointer)this->nb_threads;
      lVar25 = lVar25 + 0xa0;
    } while (pfVar36 < pfVar17);
    if (pfVar17 != (pointer)0x0) {
      lVar25 = 0;
      pfVar36 = (pointer)0x0;
      do {
        local_240 = (undefined1  [8])
                    ((ulong)CONCAT31(local_240._5_3_,pfVar36 == (pointer)0x0) << 0x20);
        pfStack_238 = (filtered_directed_graph_t *)CONCAT44(pfStack_238._4_4_,dimension);
        local_230._0_8_ =
             (compressed_sparse_matrix<int> *)
             ((long)&(((this->coboundary_matrix).
                       super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bounds).
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_map + lVar25);
        local_230._8_8_ = this->graph;
        local_230._16_8_ = (vector<float,_std::allocator<float>_> *)local_2e0;
        local_230._24_8_ = &local_2b0;
        local_230._32_8_ =
             (pointer)(long)(int)(this->cell_count).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)local_2c0];
        local_230._40_8_ = pfVar17;
        local_230._48_2_ = this->modulus;
        if (local_288.
            super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_288.
            super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
          ::_M_realloc_insert<directed_flag_complex_computer::store_coboundaries_in_cache_t>
                    ((vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                      *)&local_288,
                     (iterator)
                     local_288.
                     super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (store_coboundaries_in_cache_t *)local_240);
        }
        else {
          psVar28 = (store_coboundaries_in_cache_t *)local_240;
          pcVar22 = local_288.
                    super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
            bVar6 = psVar28->is_first;
            uVar8 = *(undefined3 *)&psVar28->field_0x5;
            ((store_coboundaries_in_cache_t *)pcVar22)->current_index = psVar28->current_index;
            ((store_coboundaries_in_cache_t *)pcVar22)->is_first = bVar6;
            *(undefined3 *)&((store_coboundaries_in_cache_t *)pcVar22)->field_0x5 = uVar8;
            psVar28 = (store_coboundaries_in_cache_t *)((long)psVar28 + (ulong)bVar37 * -0x10 + 8);
            pcVar22 = (pointer)((long)pcVar22 + (ulong)bVar37 * -0x10 + 8);
          }
          local_288.
          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_288.
                               super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0x48);
        }
        pfVar36 = (pointer)((long)pfVar36 + 1);
        pfVar17 = (pointer)this->nb_threads;
        lVar25 = lVar25 + 0xa0;
      } while (pfVar36 < pfVar17);
    }
  }
  directed_flag_complex_t::
  for_each_cell<directed_flag_complex_computer::store_coboundaries_in_cache_t>
            (&this->flag_complex,
             (vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
              *)&local_288,dimension,-1);
  if (this->nb_threads == 0) {
    uVar29 = 0;
  }
  else {
    puVar4 = (this->coboundary_matrix_offsets).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pppuVar18 = &(((this->coboundary_matrix).
                   super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->bounds).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
    uVar32 = 0;
    uVar29 = 0;
    do {
      puVar4[uVar32] = uVar29;
      uVar29 = uVar29 + ((((ulong)((long)*pppuVar18 - (long)pppuVar18[-4]) >> 3) - 1) +
                        (ulong)(*pppuVar18 == (_Map_pointer)0x0)) * 0x40 +
               ((long)pppuVar18[-5] - (long)pppuVar18[-7] >> 3) +
               ((long)((iterator *)(pppuVar18 + -3))->_M_cur - (long)pppuVar18[-2] >> 3);
      uVar32 = uVar32 + 1;
      pppuVar18 = pppuVar18 + 0x14;
    } while (uVar32 < this->nb_threads);
  }
  (local_2b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)local_2c0] = uVar29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"preparing dimension ",0x14);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,": done computing coboundaries, now reducing memory consumption",0x3e);
  poVar14 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\r",1);
  if (local_288.
      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
             *)&local_268);
  if ((_Map_pointer)local_2b0._M_cur != (_Map_pointer)0x0) {
    operator_delete(local_2b0._M_cur,(long)local_2b0._M_last - (long)local_2b0._M_cur);
  }
  std::
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
             *)local_2e0);
  iVar12 = std::__cxx11::string::compare((char *)local_38);
  if (iVar12 != 0) {
    if (this->nb_threads != 0) {
      local_2c0 = (vector<float,_std::allocator<float>_> *)_VTT;
      local_2b8 = __filebuf;
      uVar32 = 0;
      do {
        local_2e0._0_8_ = local_2e0 + 0x10;
        pcVar2 = (this->cache)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2e0,pcVar2,pcVar2 + (this->cache)._M_string_length);
        std::__cxx11::string::append((char *)local_2e0);
        uVar24 = this->current_dimension;
        uVar7 = -uVar24;
        if (0 < (int)uVar24) {
          uVar7 = uVar24;
        }
        uVar30 = 1;
        if (9 < uVar7) {
          uVar19 = (ulong)uVar7;
          uVar10 = 4;
          do {
            uVar30 = uVar10;
            uVar13 = (uint)uVar19;
            if (uVar13 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_001208ff;
            }
            if (uVar13 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_001208ff;
            }
            if (uVar13 < 10000) goto LAB_001208ff;
            uVar19 = uVar19 / 10000;
            uVar10 = uVar30 + 4;
          } while (99999 < uVar13);
          uVar30 = uVar30 + 1;
        }
LAB_001208ff:
        local_240 = (undefined1  [8])local_230;
        std::__cxx11::string::_M_construct
                  ((ulong)local_240,(char)uVar30 - (char)((int)uVar24 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                      *)local_240)->_M_h).field_0x0 + (ulong)(uVar24 >> 0x1f)),
                   uVar30,uVar7);
        std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
        if (local_240 != (undefined1  [8])local_230) {
          operator_delete((void *)local_240,
                          (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_230._0_8_)->
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Deque_impl_data._M_map + 1));
        }
        std::__cxx11::string::append(local_2e0);
        cVar26 = '\x01';
        if (9 < uVar32) {
          uVar19 = uVar32;
          cVar11 = '\x04';
          do {
            cVar26 = cVar11;
            if (uVar19 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_001209e8;
            }
            if (uVar19 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_001209e8;
            }
            if (uVar19 < 10000) goto LAB_001209e8;
            bVar6 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar11 = cVar26 + '\x04';
          } while (bVar6);
          cVar26 = cVar26 + '\x01';
        }
LAB_001209e8:
        local_240 = (undefined1  [8])local_230;
        std::__cxx11::string::_M_construct((ulong)local_240,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_240,(uint)pfStack_238,uVar32)
        ;
        std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
        if (local_240 != (undefined1  [8])local_230) {
          operator_delete((void *)local_240,
                          (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_230._0_8_)->
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Deque_impl_data._M_map + 1));
        }
        std::ofstream::ofstream(local_240,(char *)local_2e0._0_8_,_S_bin);
        local_28c = -NAN;
        std::ostream::write(local_240,
                            (long)((this->cell_count).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                  (long)this->current_dimension + 1));
        std::ostream::write(local_240,
                            (long)((this->coboundary_matrix_offsets).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar32));
        pcVar35 = (this->coboundary_matrix).
                  super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppuVar5 = pcVar35[uVar32].bounds.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node;
        local_288.
        super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)pcVar35[uVar32].bounds.
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)pcVar35[uVar32].bounds.
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                       ((long)pcVar35[uVar32].bounds.
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)pcVar35[uVar32].bounds.
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                      ((((ulong)((long)ppuVar5 -
                                (long)pcVar35[uVar32].bounds.
                                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                      (ulong)(ppuVar5 == (_Map_pointer)0x0)) * 0x40);
        std::ostream::write(local_240,(long)&local_288);
        if (local_288.
            super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pcVar22 = (pointer)0x0;
          do {
            std::ostream::write(local_240,(long)&local_28c);
            compressed_sparse_matrix<int>::cbegin
                      (&local_2b0,
                       (this->coboundary_matrix).
                       super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar32,(size_t)pcVar22);
            pcVar35 = (this->coboundary_matrix).
                      super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while (compressed_sparse_matrix<int>::cend(&local_268,pcVar35 + uVar32,(size_t)pcVar22),
                  local_2b0._M_cur != local_268._M_cur) {
              std::ostream::write(local_240,(long)local_2b0._M_cur);
              local_2b0._M_cur = (_Elt_pointer)((long)local_2b0._M_cur + 4);
              if (local_2b0._M_cur == local_2b0._M_last) {
                local_2b0._M_cur = local_2b0._M_node[1];
                local_2b0._M_last = (_Elt_pointer)((long)local_2b0._M_cur + 0x200);
                local_2b0._M_first = local_2b0._M_cur;
                local_2b0._M_node = local_2b0._M_node + 1;
              }
              pcVar35 = (this->coboundary_matrix).
                        super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pcVar22 = (pointer)((long)&pcVar22->current_index + 1);
          } while (pcVar22 < local_288.
                             super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        std::ofstream::close();
        local_240 = (undefined1  [8])local_2c0;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         (local_240 +
         *(long *)&(((cell_hash_map_t *)((long)local_2c0 + -0x40))->
                   super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                   )._M_h._M_rehash_policy) = local_2b8;
        std::filebuf::~filebuf((filebuf *)&pfStack_238);
        std::ios_base::~ios_base(local_148);
        if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
          operator_delete((void *)local_2e0._0_8_,
                          (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                     *)local_2e0._16_8_)->_M_h).field_0x1);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < this->nb_threads);
    }
    pcVar2 = (this->cache)._M_dataplus._M_p;
    local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e0,pcVar2,pcVar2 + (this->cache)._M_string_length);
    std::__cxx11::string::append((char *)local_2e0);
    uVar24 = this->current_dimension;
    uVar7 = -uVar24;
    if (0 < (int)uVar24) {
      uVar7 = uVar24;
    }
    uVar30 = 1;
    if (9 < uVar7) {
      uVar32 = (ulong)uVar7;
      uVar10 = 4;
      do {
        uVar30 = uVar10;
        uVar13 = (uint)uVar32;
        if (uVar13 < 100) {
          uVar30 = uVar30 - 2;
          goto LAB_00120cdf;
        }
        if (uVar13 < 1000) {
          uVar30 = uVar30 - 1;
          goto LAB_00120cdf;
        }
        if (uVar13 < 10000) goto LAB_00120cdf;
        uVar32 = uVar32 / 10000;
        uVar10 = uVar30 + 4;
      } while (99999 < uVar13);
      uVar30 = uVar30 + 1;
    }
LAB_00120cdf:
    local_240 = (undefined1  [8])local_230;
    std::__cxx11::string::_M_construct((ulong)local_240,(char)uVar30 - (char)((int)uVar24 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                  *)local_240)->_M_h).field_0x0 + (ulong)(uVar24 >> 0x1f)),uVar30,
               uVar7);
    std::__cxx11::string::_M_append(local_2e0,(ulong)local_240);
    if (local_240 != (undefined1  [8])local_230) {
      operator_delete((void *)local_240,
                      (ulong)((long)&(((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      local_230._0_8_)->
                                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Deque_impl_data._M_map + 1));
    }
    std::ofstream::ofstream(local_240,(char *)local_2e0._0_8_,_S_bin);
    pfVar36 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar17 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pfVar36 != pfVar17) {
      do {
        local_2b0._M_cur = (_Elt_pointer)CONCAT44(local_2b0._M_cur._4_4_,*pfVar36);
        std::ostream::write(local_240,(long)&local_2b0);
        pfVar36 = pfVar36 + 1;
      } while (pfVar36 != pfVar17);
    }
    std::ofstream::close();
    local_240 = (undefined1  [8])_VTT;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
     (local_240 +
     *(long *)&_VTT[-1].
               super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
               ._M_h._M_rehash_policy) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&pfStack_238);
    std::ios_base::~ios_base(local_148);
    if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
      operator_delete((void *)local_2e0._0_8_,
                      (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                 *)local_2e0._16_8_)->_M_h).field_0x1);
    }
  }
  return;
}

Assistant:

void directed_flag_complex_computer_t::prepare_next_dimension(int dimension) {
	if (dimension == 0) return;

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "preparing dimension " << dimension << ": indexing " << (dimension) << "-dimensional cells"
	          << std::flush << "\r";
#endif

	assert(dimension == current_dimension + 1);
	current_dimension = dimension;
	cell_hasher_t::set_current_cell_dimension(dimension + 1);
	cell_count.resize(dimension + 2);

	// Clean up
	for (auto p : coboundary_matrix) { p.clear(); }

	if (dimension > max_dimension || _is_top_dimension) return;

	if (cache != "") {
#ifdef USE_COEFFICIENTS
		// TODO: Make this work
		std::string err_msg = "Sorry, caching does not work with coefficients yet.";
		throw std::logic_error(err_msg);
#endif
		bool loaded_from_file = false;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix[i].clear();
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ifstream f(fname.c_str(), std::ios::binary);
			if (i == 0 && !f.good()) break;
			loaded_from_file = true;

			f.read((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			f.read((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));

			size_t this_size;
			f.read((char*)&(this_size), sizeof(size_t));

			index_t next_value;
			while (this_size > 0 && f.read((char*)&next_value, sizeof(index_t))) {
				if (next_value == -1)
					coboundary_matrix[i].append_column();
				else
					coboundary_matrix[i].push_back(next_value);
			}
			f.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ifstream f(fname.c_str(), std::ios::binary);
		next_filtration.clear();
		value_t next_value;
		while (f.read((char*)&next_value, sizeof(value_t))) next_filtration.push_back(next_value);
		f.close();

		if (loaded_from_file) {
			_is_top_dimension = cell_count[current_dimension + 1] == 0;
			return;
		}
	}

	{
		if (filtration_algorithm != nullptr) {
			// Add the current and next cells into the hash and compute the new
			// filtration
			std::vector<cell_hash_map_t> _cache_current_cells(nb_threads);
			std::vector<size_t> _cache_current_cells_offsets(nb_threads, 0);
			std::vector<add_cell_index_to_cache_t> init_current_cell_cache;
			for (size_t i = 0; i < nb_threads; i++) {
				init_current_cell_cache.push_back(add_cell_index_to_cache_t(_cache_current_cells[i]));
			}

			cell_hasher_t::set_current_cell_dimension(dimension);

			// Add the current cells into the cache if the filtration algorithm
			// needs them
			if (filtration_algorithm->needs_face_filtration())
				flag_complex.for_each_cell(init_current_cell_cache, dimension);

			// If we will actually compute coboundaries, then compute the
			// filtration. Also if we need the face filtrations.
			if (dimension + 1 >= min_dimension || filtration_algorithm->needs_face_filtration()) {
#ifdef INDICATE_PROGRESS
				std::cout << "\033[K"
				          << "preparing dimension " << dimension << ": computing the filtration of all "
				          << (dimension + 1) << "-dimensional cells" << std::flush << "\r";
#endif
				size_t offset = 0;
				std::vector<compute_filtration_t> compute_filtration;
				for (size_t i = 0; i < nb_threads; i++) {
					_cache_current_cells_offsets[i] = offset;
					if (filtration_algorithm->needs_face_filtration()) { offset += _cache_current_cells[i].size(); }
					compute_filtration.push_back(compute_filtration_t(
					    filtration_algorithm, graph, dimension == 1 ? graph.edge_filtration : next_filtration,
					    _cache_current_cells, nb_threads, _cache_current_cells_offsets.data()));
				}
				flag_complex.for_each_cell(compute_filtration, dimension + 1);

				size_t _cell_count = 0;
				for (size_t i = 0; i < nb_threads; i++) _cell_count += compute_filtration[i].number_of_cells();
				cell_count[dimension + 1] = _cell_count;
				if (_cell_count == 0) _is_top_dimension = true;

				// Combine the filtration
				next_filtration.clear();
				next_filtration.reserve(_cell_count);
				for (size_t i = 0; i < nb_threads; i++) {
					for (auto f : compute_filtration[i].filtration()) next_filtration.push_back(f);
				}
			}
		}

		// If we do not want the homology in the next degree, then we can stop
		// here
		if (dimension + 1 < min_dimension) return;

		cell_hasher_t::set_current_cell_dimension(dimension + 1);

		std::vector<cell_hash_map_t> _cache_next_cells(nb_threads);
		std::vector<size_t> _cache_next_cells_offsets(nb_threads, 0);
		std::vector<add_cell_index_to_cache_t> init_next_cell_cache;
		for (size_t i = 0; i < nb_threads; i++) {
			init_next_cell_cache.push_back(add_cell_index_to_cache_t(_cache_next_cells[i]));
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension << ": indexing " << (dimension + 1) << "-dimensional cells"
		          << std::flush << "\r";
#endif

		size_t _cell_count = 0;

		if (!is_top_dimension()) {
			flag_complex.for_each_cell(init_next_cell_cache, dimension + 1);

			for (size_t i = 0; i < nb_threads; i++) {
				_cache_next_cells_offsets[i] = _cell_count;
				_cell_count += init_next_cell_cache[i].number_of_cells();
			}
			cell_count[dimension + 1] = _cell_count;
			if (_cell_count == 0) _is_top_dimension = true;
		}

		// Now compute the coboundaries
		std::vector<store_coboundaries_in_cache_t> store_coboundaries;
		for (size_t i = 0; i < nb_threads; i++) coboundary_matrix[i] = compressed_sparse_matrix<entry_t>();
		for (size_t i = 0; i < nb_threads; i++) {
			store_coboundaries.push_back(store_coboundaries_in_cache_t(
			    coboundary_matrix[i], dimension, graph, _cache_next_cells, _cache_next_cells_offsets,
			    int(cell_count[dimension]), i == 0, nb_threads, modulus));
		}
		flag_complex.for_each_cell(store_coboundaries, dimension);

		_cell_count = 0;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix_offsets[i] = _cell_count;
			_cell_count += coboundary_matrix[i].size();
		}
		cell_count[dimension] = _cell_count;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension
		          << ": done computing coboundaries, now reducing memory consumption" << std::flush << "\r";
#endif
	}

	if (cache != "") {
		for (size_t i = 0; i < nb_threads; i++) {
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ofstream o(fname.c_str(), std::ios::binary);
			index_t separator = -1;
			o.write((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			o.write((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));
			size_t this_size = coboundary_matrix[i].size();
			o.write((char*)&this_size, sizeof(size_t));
			for (auto j = 0ul; j < this_size; j++) {
				o.write((char*)&(separator), sizeof(index_t));
				for (auto it = coboundary_matrix[i].cbegin(j); it != coboundary_matrix[i].cend(j); ++it) {
					o.write((char*)&(*it), sizeof(index_t));
				}
			}
			o.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ofstream o(fname.c_str(), std::ios::binary);
		for (auto f : next_filtration) o.write((char*)&f, sizeof(value_t));
		o.close();
	}
}